

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_fcmpu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 pTVar1;
  uintptr_t o;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->fpu_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_reset_fpstatus,(TCGTemp *)0x0,1,&local_58);
    pTVar1 = tcg_const_i32_ppc64(s,ctx->opcode >> 0x17 & 7);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0xc & 0x1f0) + 0x12b28);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12b28);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_50 = ts;
    local_48 = ts_00;
    local_40 = (TCGTemp *)(pTVar1 + (long)s);
    tcg_gen_callN_ppc64(s,helper_fcmpu,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar1 + (long)s));
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_float_check_status,(TCGTemp *)0x0,1,&local_58);
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_fcmpu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i32 crf;
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_reset_fpstatus(tcg_ctx);
    crf = tcg_const_i32(tcg_ctx, crfD(ctx->opcode));
    get_fpr(tcg_ctx, t0, rA(ctx->opcode));
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    gen_helper_fcmpu(tcg_ctx, tcg_ctx->cpu_env, t0, t1, crf);
    tcg_temp_free_i32(tcg_ctx, crf);
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}